

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvrktest.cpp
# Opt level: O0

Result TestAnalogInputs(AmpIO **Board,BasePort *Port)

{
  uint32_t uVar1;
  ulong uVar2;
  ostream *poVar3;
  void *this;
  __type _Var4;
  unsigned_long reading;
  uint local_20;
  int channel_index;
  int board_index;
  Result result;
  BasePort *Port_local;
  AmpIO **Board_local;
  
  channel_index = 0;
  (*Port->_vptr_BasePort[0x1d])();
  for (local_20 = 0; (int)local_20 < NUM_FPGA; local_20 = local_20 + 1) {
    for (reading._4_4_ = 0; (int)reading._4_4_ < NUM_CHANNEL_PER_FPGA;
        reading._4_4_ = reading._4_4_ + 1) {
      uVar1 = AmpIO::GetAnalogInput(Board[(int)local_20],reading._4_4_);
      uVar2 = (ulong)uVar1;
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::hex);
      poVar3 = std::operator<<(poVar3,"board ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
      poVar3 = std::operator<<(poVar3," pot channel ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,reading._4_4_);
      poVar3 = std::operator<<(poVar3," - ");
      poVar3 = std::operator<<(poVar3," expected=");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,POT_TEST_ADC_COUNT[(int)(local_20 * 4 + reading._4_4_)]);
      poVar3 = std::operator<<(poVar3," measured=");
      std::ostream::operator<<(poVar3,uVar2);
      poVar3 = (ostream *)std::ostream::operator<<(logfile,std::hex);
      poVar3 = std::operator<<(poVar3,"board ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
      poVar3 = std::operator<<(poVar3," pot channel ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,reading._4_4_);
      poVar3 = std::operator<<(poVar3," - ");
      poVar3 = std::operator<<(poVar3," expected=");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,POT_TEST_ADC_COUNT[(int)(local_20 * 4 + reading._4_4_)]);
      poVar3 = std::operator<<(poVar3," measured=");
      std::ostream::operator<<(poVar3,uVar2);
      _Var4 = std::fabs<long>(uVar2 - POT_TEST_ADC_COUNT[(int)(local_20 * 4 + reading._4_4_)]);
      if (_Var4 <= 1280.0) {
        poVar3 = std::operator<<((ostream *)&std::cout," ... \x1b[0;32m[PASS]\x1b[0m");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)logfile,"... PASS");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout," ... \x1b[1;91m[FAIL]\x1b[0m");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)logfile,"... FAIL");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)logfile,"Tolerance=");
        this = (void *)std::ostream::operator<<(poVar3,0x500);
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        channel_index = 1;
        _Var4 = std::fabs<long>(uVar2 - POT_TEST_ADC_COUNT
                                        [(int)((local_20 ^ 1) * 4 + reading._4_4_)]);
        if (_Var4 < 1280.0) {
          poVar3 = std::operator<<((ostream *)&std::cout,(string *)&COLOR_ERROR_abi_cxx11_);
          poVar3 = std::operator<<(poVar3,"(Looks like the 68-pin cable is crossed!)");
          poVar3 = std::operator<<(poVar3,(string *)&COLOR_OFF_abi_cxx11_);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          poVar3 = std::operator<<((ostream *)logfile,"Crossed scsi?");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          channel_index = 2;
        }
      }
    }
  }
  return channel_index;
}

Assistant:

Result TestAnalogInputs(AmpIO **Board, BasePort *Port) {
    Result result = pass;
    Port->ReadAllBoards();
    for (int board_index = 0; board_index < NUM_FPGA; board_index++) {
        for (int channel_index = 0; channel_index < NUM_CHANNEL_PER_FPGA; channel_index++) {
            unsigned long reading = Board[board_index]->GetAnalogInput(channel_index);
            std::cout << std::hex << "board " << board_index << " pot channel " << channel_index << " - "
                        << " expected="
                        << POT_TEST_ADC_COUNT[board_index * 4 + channel_index] << " measured=" << reading;
            logfile << std::hex << "board " << board_index << " pot channel " << channel_index << " - "
                        << " expected="
                        << POT_TEST_ADC_COUNT[board_index * 4 + channel_index] << " measured=" << reading;
            if (std::fabs((long) reading - (long) POT_TEST_ADC_COUNT[board_index * 4 + channel_index]) > POT_TEST_ADC_ERROR_TOLERANCE) {
                std::cout << FAIL << std::endl;
                logfile << "... FAIL" << std::endl;
                logfile << "Tolerance=" << POT_TEST_ADC_ERROR_TOLERANCE << std::endl;
                result = fail;
                // check for swapped cable
                if (std::fabs((long) reading - (long) POT_TEST_ADC_COUNT[(1 ^ board_index)  * 4 + channel_index]) <
                    POT_TEST_ADC_ERROR_TOLERANCE) {
                    std::cout << COLOR_ERROR << "(Looks like the 68-pin cable is crossed!)" << COLOR_OFF
                                << std::endl;
                    logfile << "Crossed scsi?" << std::endl;
                    result = fatal_fail;
                }

            } else {
                std::cout << PASS << std::endl;
                logfile << "... PASS" << std::endl;
            }
        }
    }
    
    return result;
}